

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void __thiscall testing::internal::UnitTestImpl::ListTestsMatchingFilter(UnitTestImpl *this)

{
  TestSuite *pTVar1;
  pointer ppTVar2;
  TestInfo *pTVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  __uniq_ptr_impl<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _Var5;
  bool bVar6;
  pointer ppTVar7;
  FILE *__stream;
  size_t j;
  ulong uVar8;
  int iVar9;
  _Alloc_hider str;
  char *str_00;
  XmlUnitTestResultPrinter local_230;
  char *local_208 [4];
  pointer local_1e8;
  pointer local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  stringstream stream;
  ostream local_1a8 [376];
  
  local_1e8 = (this->test_suites_).
              super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  ppTVar7 = (this->test_suites_).
            super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  while (ppTVar7 != local_1e8) {
    pTVar1 = *ppTVar7;
    uVar8 = 0;
    bVar6 = false;
    local_1e0 = ppTVar7;
    while( true ) {
      ppTVar2 = (pTVar1->test_info_list_).
                super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(pTVar1->test_info_list_).
                        super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar2 >> 3) <= uVar8)
      break;
      pTVar3 = ppTVar2[uVar8];
      if (pTVar3->matches_filter_ == true) {
        if (!bVar6) {
          printf("%s.",(pTVar1->name_)._M_dataplus._M_p);
          pbVar4 = (pTVar1->type_param_)._M_t.
                   super___uniq_ptr_impl<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl;
          if ((pbVar4 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
             && ((pbVar4->_M_dataplus)._M_p != (pointer)0x0)) {
            iVar9 = 0x1532e2;
            printf("  # %s = ");
            pbVar4 = (pTVar1->type_param_)._M_t.
                     super___uniq_ptr_impl<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl;
            if (pbVar4 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
            {
              str._M_p = (char *)0x0;
            }
            else {
              str._M_p = (pbVar4->_M_dataplus)._M_p;
            }
            PrintOnOneLine(str._M_p,iVar9);
          }
          putchar(10);
        }
        printf("  %s",(pTVar3->name_)._M_dataplus._M_p);
        _Var5._M_t.
        super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (pTVar3->value_param_)._M_t.
             super___uniq_ptr_impl<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t;
        if (((_Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )_Var5._M_t.
               super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl !=
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
           (*(long *)_Var5._M_t.
                     super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl != 0)) {
          iVar9 = 0x153348;
          printf("  # %s = ");
          _Var5._M_t.
          super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (pTVar3->value_param_)._M_t.
               super___uniq_ptr_impl<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t;
          if ((_Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )_Var5._M_t.
                super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            str_00 = (char *)0x0;
          }
          else {
            str_00 = *(char **)_Var5._M_t.
                               super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl;
          }
          PrintOnOneLine(str_00,iVar9);
        }
        putchar(10);
        bVar6 = true;
      }
      uVar8 = uVar8 + 1;
    }
    ppTVar7 = local_1e0 + 1;
  }
  fflush(_stdout);
  UnitTestOptions::GetOutputFormat_abi_cxx11_();
  bVar6 = std::operator==(&local_1d8,"xml");
  if (!bVar6) {
    bVar6 = std::operator==(&local_1d8,"json");
    if (!bVar6) goto LAB_00142c8a;
  }
  UnitTestOptions::GetAbsolutePathToOutputFile_abi_cxx11_();
  std::__cxx11::string::string
            ((string *)&stream,
             (char *)local_230.super_EmptyTestEventListener.super_TestEventListener.
                     _vptr_TestEventListener,(allocator *)local_208);
  __stream = (FILE *)OpenFileForWriting((string *)&stream);
  std::__cxx11::string::~string((string *)&stream);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::stringstream::stringstream((stringstream *)&stream);
  bVar6 = std::operator==(&local_1d8,"xml");
  if (bVar6) {
    UnitTestOptions::GetAbsolutePathToOutputFile_abi_cxx11_();
    XmlUnitTestResultPrinter::XmlUnitTestResultPrinter(&local_230,local_208[0]);
    XmlUnitTestResultPrinter::PrintXmlTestsList(local_1a8,&this->test_suites_);
    XmlUnitTestResultPrinter::~XmlUnitTestResultPrinter(&local_230);
LAB_00142c41:
    std::__cxx11::string::~string((string *)local_208);
  }
  else {
    bVar6 = std::operator==(&local_1d8,"json");
    if (bVar6) {
      UnitTestOptions::GetAbsolutePathToOutputFile_abi_cxx11_();
      JsonUnitTestResultPrinter::JsonUnitTestResultPrinter
                ((JsonUnitTestResultPrinter *)&local_230,local_208[0]);
      JsonUnitTestResultPrinter::PrintJsonTestList(local_1a8,&this->test_suites_);
      JsonUnitTestResultPrinter::~JsonUnitTestResultPrinter((JsonUnitTestResultPrinter *)&local_230)
      ;
      goto LAB_00142c41;
    }
  }
  StringStreamToString((string *)&local_230,&stream);
  fputs((char *)local_230.super_EmptyTestEventListener.super_TestEventListener.
                _vptr_TestEventListener,__stream);
  std::__cxx11::string::~string((string *)&local_230);
  fclose(__stream);
  std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
LAB_00142c8a:
  std::__cxx11::string::~string((string *)&local_1d8);
  return;
}

Assistant:

void UnitTestImpl::ListTestsMatchingFilter() {
  // Print at most this many characters for each type/value parameter.
  const int kMaxParamLength = 250;

  for (auto* test_suite : test_suites_) {
    bool printed_test_suite_name = false;

    for (size_t j = 0; j < test_suite->test_info_list().size(); j++) {
      const TestInfo* const test_info = test_suite->test_info_list()[j];
      if (test_info->matches_filter_) {
        if (!printed_test_suite_name) {
          printed_test_suite_name = true;
          printf("%s.", test_suite->name());
          if (test_suite->type_param() != nullptr) {
            printf("  # %s = ", kTypeParamLabel);
            // We print the type parameter on a single line to make
            // the output easy to parse by a program.
            PrintOnOneLine(test_suite->type_param(), kMaxParamLength);
          }
          printf("\n");
        }
        printf("  %s", test_info->name());
        if (test_info->value_param() != nullptr) {
          printf("  # %s = ", kValueParamLabel);
          // We print the value parameter on a single line to make the
          // output easy to parse by a program.
          PrintOnOneLine(test_info->value_param(), kMaxParamLength);
        }
        printf("\n");
      }
    }
  }
  fflush(stdout);
  const std::string& output_format = UnitTestOptions::GetOutputFormat();
  if (output_format == "xml" || output_format == "json") {
    FILE* fileout = OpenFileForWriting(
        UnitTestOptions::GetAbsolutePathToOutputFile().c_str());
    std::stringstream stream;
    if (output_format == "xml") {
      XmlUnitTestResultPrinter(
          UnitTestOptions::GetAbsolutePathToOutputFile().c_str())
          .PrintXmlTestsList(&stream, test_suites_);
    } else if (output_format == "json") {
      JsonUnitTestResultPrinter(
          UnitTestOptions::GetAbsolutePathToOutputFile().c_str())
          .PrintJsonTestList(&stream, test_suites_);
    }
    fprintf(fileout, "%s", StringStreamToString(&stream).c_str());
    fclose(fileout);
  }
}